

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ffs_marshal.c
# Opt level: O0

ControlInfo * GetPriorControl(SstStream Stream,FMFormat Format)

{
  ControlInfo *tmp;
  FFSReaderMarshalBase *Info;
  FMFormat Format_local;
  SstStream Stream_local;
  
  tmp = *(ControlInfo **)((long)Stream->ReaderMarshalData + 0x48);
  while( true ) {
    if (tmp == (ControlInfo *)0x0) {
      return (ControlInfo *)0x0;
    }
    if (tmp->Format == Format) break;
    tmp = tmp->Next;
  }
  return tmp;
}

Assistant:

static struct ControlInfo *GetPriorControl(SstStream Stream, FMFormat Format)
{
    struct FFSReaderMarshalBase *Info = Stream->ReaderMarshalData;
    struct ControlInfo *tmp = Info->ControlBlocks;
    while (tmp)
    {
        if (tmp->Format == Format)
        {
            return tmp;
        }
        tmp = tmp->Next;
    }
    return NULL;
}